

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ar.c
# Opt level: O0

char * ar_basename(char *path)

{
  size_t sVar1;
  char *in_RDI;
  bool bVar2;
  char *startp;
  char *endp;
  char *local_20;
  char *local_8;
  
  sVar1 = strlen(in_RDI);
  local_20 = in_RDI + (sVar1 - 1);
  if (*local_20 == '/') {
    local_8 = (char *)0x0;
  }
  else {
    while( true ) {
      bVar2 = false;
      if (in_RDI < local_20) {
        bVar2 = local_20[-1] != '/';
      }
      if (!bVar2) break;
      local_20 = local_20 + -1;
    }
    local_8 = local_20;
  }
  return local_8;
}

Assistant:

static const char *
ar_basename(const char *path)
{
	const char *endp, *startp;

	endp = path + strlen(path) - 1;
	/*
	 * For filename with trailing slash(es), we return
	 * NULL indicating an error.
	 */
	if (*endp == '/')
		return (NULL);

	/* Find the start of the base */
	startp = endp;
	while (startp > path && *(startp - 1) != '/')
		startp--;
	
	return (startp);
}